

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QAction * __thiscall
QMenuPrivate::exec(QMenuPrivate *this,QPoint *p,QAction *action,PositionFunction *positionFunction)

{
  bool bVar1;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QMenu *q;
  QPointer<QObject> guard;
  QEventLoop evtLoop;
  PositionFunction *in_stack_00000168;
  QAction *in_stack_00000170;
  QPoint *in_stack_00000178;
  QMenuPrivate *in_stack_00000180;
  function<QPoint_(const_QSize_&)> *in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QAction *local_58;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QWidget::ensurePolished((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QWidget::createWinId(in_stack_ffffffffffffff50);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop((QEventLoop *)&local_18,(QObject *)0x0);
  in_RDI->eventLoop = (QEventLoop *)&local_18;
  std::function<QPoint_(const_QSize_&)>::function
            ((function<QPoint_(const_QSize_&)> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
            );
  popup(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  std::function<QPoint_(const_QSize_&)>::~function((function<QPoint_(const_QSize_&)> *)0x64992f);
  QPointer<QObject>::QPointer<void>
            ((QPointer<QObject> *)in_stack_ffffffffffffff50,(QObject *)in_stack_ffffffffffffff48);
  if (in_RDI->eventLoop != (QEventLoop *)0x0) {
    in_stack_ffffffffffffff50 = (QWidget *)in_RDI->eventLoop;
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_stack_ffffffffffffff50,
               (ProcessEventsFlag)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    QEventLoop::exec((QFlags_conflict1 *)in_stack_ffffffffffffff50);
  }
  bVar1 = QPointer<QObject>::isNull((QPointer<QObject> *)0x64999a);
  if (bVar1) {
    local_58 = (QAction *)0x0;
  }
  else {
    local_58 = ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x6499c4);
    QPointer<QAction>::operator=
              ((QPointer<QAction> *)in_stack_ffffffffffffff50,(QAction *)in_stack_ffffffffffffff48);
    in_RDI->eventLoop = (QEventLoop *)0x0;
    QPointer<QScreen>::clear((QPointer<QScreen> *)0x6499fa);
  }
  QPointer<QObject>::~QPointer((QPointer<QObject> *)0x649a16);
  QEventLoop::~QEventLoop((QEventLoop *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_58;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenuPrivate::exec(const QPoint &p, QAction *action, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    q->ensurePolished();
    q->createWinId();
    QEventLoop evtLoop;
    eventLoop = &evtLoop;
    popup(p, action, positionFunction);

    QPointer<QObject> guard = q;
    if (eventLoop) // popup might have reset if there was nothing to show
        (void)eventLoop->exec();
    if (guard.isNull())
        return nullptr;

    action = syncAction;
    syncAction = nullptr;
    eventLoop = nullptr;
    popupScreen.clear();
    return action;
}